

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O0

void index_tree_node_end(index_tree_node *node,lzma_allocator *allocator,
                        _func_void_void_ptr_lzma_allocator_ptr *free_func)

{
  _func_void_void_ptr_lzma_allocator_ptr *free_func_local;
  lzma_allocator *allocator_local;
  index_tree_node *node_local;
  
  if (node->left != (index_tree_node *)0x0) {
    index_tree_node_end(node->left,allocator,free_func);
  }
  if (node->right != (index_tree_node *)0x0) {
    index_tree_node_end(node->right,allocator,free_func);
  }
  (*free_func)(node,allocator);
  return;
}

Assistant:

static void
index_tree_node_end(index_tree_node *node, const lzma_allocator *allocator,
		void (*free_func)(void *node, const lzma_allocator *allocator))
{
	// The tree won't ever be very huge, so recursion should be fine.
	// 20 levels in the tree is likely quite a lot already in practice.
	if (node->left != NULL)
		index_tree_node_end(node->left, allocator, free_func);

	if (node->right != NULL)
		index_tree_node_end(node->right, allocator, free_func);

	free_func(node, allocator);
	return;
}